

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po_test.cc
# Opt level: O0

void __thiscall
bool_implicit_and_explicit_options::test_method(bool_implicit_and_explicit_options *this)

{
  bool bVar1;
  pointer poVar2;
  option_group_definition arg_group;
  unique_ptr<VW::config::options_i,_std::default_delete<VW::config::options_i>_> options;
  unique_ptr<char_*,_std::default_delete<char_*>_> argv;
  int argc;
  char command_line [18];
  bool bool_switch_unspecified;
  bool bool_switch;
  pointer in_stack_fffffffffffffb78;
  undefined1 pv_;
  typed_option<bool> *in_stack_fffffffffffffb80;
  char *in_stack_fffffffffffffb88;
  unique_ptr<VW::config::options_i,_std::default_delete<VW::config::options_i>_>
  *in_stack_fffffffffffffb90;
  char **in_stack_fffffffffffffbc0;
  undefined8 uVar3;
  undefined4 in_stack_fffffffffffffbc8;
  undefined2 in_stack_fffffffffffffbcc;
  undefined1 in_stack_fffffffffffffbce;
  undefined1 in_stack_fffffffffffffbcf;
  options_boost_po *in_stack_fffffffffffffbd0;
  undefined1 local_3d1 [17];
  undefined1 local_3c0 [40];
  undefined1 local_398 [16];
  basic_cstring<const_char> local_388;
  undefined1 local_371 [17];
  undefined1 local_360 [40];
  undefined1 local_338 [16];
  basic_cstring<const_char> local_328 [7];
  basic_cstring<const_char> local_2b0;
  undefined1 local_2a0 [32];
  undefined1 local_280 [24];
  undefined1 local_268 [16];
  basic_cstring<const_char> local_258;
  allocator local_241;
  string local_240 [199];
  allocator local_179;
  string local_178 [199];
  allocator local_b1;
  string local_b0 [32];
  undefined1 local_90 [104];
  char local_28 [30];
  undefined1 local_a;
  undefined1 local_9 [9];
  
  builtin_strncpy(local_28,"exe --bool_switch",0x12);
  convert_to_command_args
            ((char *)in_stack_fffffffffffffb90,(int *)in_stack_fffffffffffffb88,
             (int)((ulong)in_stack_fffffffffffffb80 >> 0x20));
  std::unique_ptr<char*,std::default_delete<char*>>::unique_ptr<std::default_delete<char*>,void>
            ((unique_ptr<char_*,_std::default_delete<char_*>_> *)in_stack_fffffffffffffb80,
             (pointer)in_stack_fffffffffffffb78);
  operator_new(0x2e8);
  std::unique_ptr<char_*,_std::default_delete<char_*>_>::get
            ((unique_ptr<char_*,_std::default_delete<char_*>_> *)in_stack_fffffffffffffb80);
  VW::config::options_boost_po::options_boost_po
            (in_stack_fffffffffffffbd0,
             CONCAT13(in_stack_fffffffffffffbcf,
                      CONCAT12(in_stack_fffffffffffffbce,in_stack_fffffffffffffbcc)),
             in_stack_fffffffffffffbc0);
  std::unique_ptr<VW::config::options_boost_po,std::default_delete<VW::config::options_boost_po>>::
  unique_ptr<std::default_delete<VW::config::options_boost_po>,void>
            ((unique_ptr<VW::config::options_boost_po,_std::default_delete<VW::config::options_boost_po>_>
              *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::unique_ptr<VW::config::options_i,std::default_delete<VW::config::options_i>>::
  unique_ptr<VW::config::options_boost_po,std::default_delete<VW::config::options_boost_po>,void>
            (in_stack_fffffffffffffb90,
             (unique_ptr<VW::config::options_boost_po,_std::default_delete<VW::config::options_boost_po>_>
              *)in_stack_fffffffffffffb88);
  std::unique_ptr<VW::config::options_boost_po,_std::default_delete<VW::config::options_boost_po>_>
  ::~unique_ptr((unique_ptr<VW::config::options_boost_po,_std::default_delete<VW::config::options_boost_po>_>
                 *)in_stack_fffffffffffffb80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"group",&local_b1);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffb80,
             (string *)in_stack_fffffffffffffb78);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"bool_switch",&local_179);
  VW::config::make_option<bool>
            ((string *)in_stack_fffffffffffffb88,(bool *)in_stack_fffffffffffffb80);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>>
            ((option_group_definition *)in_stack_fffffffffffffbd0,
             (typed_option<bool> *)
             CONCAT17(in_stack_fffffffffffffbcf,
                      CONCAT16(in_stack_fffffffffffffbce,
                               CONCAT24(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8))));
  VW::config::typed_option<bool>::~typed_option(in_stack_fffffffffffffb80);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,"bool_switch_unspecified",&local_241);
  VW::config::make_option<bool>
            ((string *)in_stack_fffffffffffffb88,(bool *)in_stack_fffffffffffffb80);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>>
            ((option_group_definition *)in_stack_fffffffffffffbd0,
             (typed_option<bool> *)
             CONCAT17(in_stack_fffffffffffffbcf,
                      CONCAT16(in_stack_fffffffffffffbce,
                               CONCAT24(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8))));
  VW::config::typed_option<bool>::~typed_option(in_stack_fffffffffffffb80);
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  do {
    poVar2 = std::unique_ptr<VW::config::options_i,_std::default_delete<VW::config::options_i>_>::
             operator->((unique_ptr<VW::config::options_i,_std::default_delete<VW::config::options_i>_>
                         *)0x19568a);
    (**poVar2->_vptr_options_i)(poVar2,local_90);
    do {
      uVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      pv_ = (undefined1)((ulong)in_stack_fffffffffffffb78 >> 0x38);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_258,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
                 ,0x78);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffb80);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar3,&local_258,0x6d,local_268);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffffb80,(bool)pv_);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffffb88,(char (*) [58])in_stack_fffffffffffffb80)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_2b0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
                 ,0x78);
      in_stack_fffffffffffffb78 = (pointer)0x0;
      boost::test_tools::tt_detail::report_assertion(local_280,local_2a0,&local_2b0,0x6d,1);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[58],_const_char_(&)[58]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[58],_const_char_(&)[58]>
                          *)0x195794);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1957a1);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    uVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_328,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
               ,0x78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb80);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar3,local_328,0x6f,local_338);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffb88,(char (*) [1])in_stack_fffffffffffffb80);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_371 + 1),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
               ,0x78);
    local_371[0] = '\x01';
    in_stack_fffffffffffffb88 = "true";
    in_stack_fffffffffffffb80 = (typed_option<bool> *)local_371;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_360,local_371 + 1,0x6f,1,2,local_9,"bool_switch");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x195bc3);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    uVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_388,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
               ,0x78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb80);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar3,&local_388,0x70,local_398);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffb88,(char (*) [1])in_stack_fffffffffffffb80);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_3d1 + 1),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
               ,0x78);
    local_3d1[0] = 0;
    in_stack_fffffffffffffb88 = "false";
    in_stack_fffffffffffffb80 = (typed_option<bool> *)local_3d1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_3c0,local_3d1 + 1,0x70,1,2,&local_a,"bool_switch_unspecified");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x195cdf);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffb80);
  std::unique_ptr<VW::config::options_i,_std::default_delete<VW::config::options_i>_>::~unique_ptr
            (in_stack_fffffffffffffb90);
  std::unique_ptr<char_*,_std::default_delete<char_*>_>::~unique_ptr
            ((unique_ptr<char_*,_std::default_delete<char_*>_> *)in_stack_fffffffffffffb80);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(bool_implicit_and_explicit_options) {
  bool bool_switch;
  bool bool_switch_unspecified;

  char command_line[] = "exe --bool_switch";
  int argc;
  // Only the returned char* needs to be deleted as the individual pointers simply point into command_line.
  std::unique_ptr<char*> argv(convert_to_command_args(command_line, argc));

  std::unique_ptr<options_i> options = std::unique_ptr<options_boost_po>(
    new options_boost_po(argc, argv.get()));

  option_group_definition arg_group("group");
  arg_group.add(make_option("bool_switch", bool_switch));
  arg_group.add(make_option("bool_switch_unspecified", bool_switch_unspecified));

  BOOST_CHECK_NO_THROW(options->add_and_parse(arg_group));

  BOOST_CHECK_EQUAL(bool_switch, true);
  BOOST_CHECK_EQUAL(bool_switch_unspecified, false);
}